

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O3

void Diligent::PipelineStateUtils::
     ExtractShaders<Diligent::ShaderGLImpl,std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>>
               (GraphicsPipelineStateCreateInfo *CreateInfo,
               vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
               *ShaderStages,bool WaitUntilShadersReady,SHADER_TYPE *ActiveShaderStages)

{
  PIPELINE_TYPE PVar1;
  pointer ppSVar2;
  char (*Args_1) [22];
  string msg;
  anon_class_24_3_81d571ad AddShaderStage;
  bool local_59;
  string local_58;
  anon_class_24_3_81d571ad local_38;
  
  Args_1 = (char (*) [22])ActiveShaderStages;
  local_59 = WaitUntilShadersReady;
  if (((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType & ~PIPELINE_TYPE_MESH) !=
      PIPELINE_TYPE_GRAPHICS) {
    FormatString<char[26],char[43]>
              (&local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.IsAnyGraphicsPipeline()",
               (char (*) [43])ActiveShaderStages);
    Args_1 = (char (*) [22])0xc7;
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,199);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  ppSVar2 = (ShaderStages->
            super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  if ((ShaderStages->
      super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>).
      _M_impl.super__Vector_impl_data._M_finish != ppSVar2) {
    (ShaderStages->
    super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>)._M_impl
    .super__Vector_impl_data._M_finish = ppSVar2;
  }
  *ActiveShaderStages = SHADER_TYPE_UNKNOWN;
  local_38.WaitUntilShadersReady = &local_59;
  PVar1 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType;
  local_38.ShaderStages = ShaderStages;
  local_38.ActiveShaderStages = ActiveShaderStages;
  if (PVar1 == PIPELINE_TYPE_MESH) {
    ExtractShaders<Diligent::ShaderGLImpl,_std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>_>
    ::anon_class_24_3_81d571ad::operator()(&local_38,CreateInfo->pAS);
    ExtractShaders<Diligent::ShaderGLImpl,_std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>_>
    ::anon_class_24_3_81d571ad::operator()(&local_38,CreateInfo->pMS);
    ExtractShaders<Diligent::ShaderGLImpl,_std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>_>
    ::anon_class_24_3_81d571ad::operator()(&local_38,CreateInfo->pPS);
    if (CreateInfo->pMS != (IShader *)0x0) goto LAB_002dbaa2;
    FormatString<char[29]>(&local_58,(char (*) [29])"Mesh shader must not be null");
    Args_1 = (char (*) [22])0xf0;
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0xf0);
  }
  else if (PVar1 == PIPELINE_TYPE_GRAPHICS) {
    ExtractShaders<Diligent::ShaderGLImpl,_std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>_>
    ::anon_class_24_3_81d571ad::operator()(&local_38,CreateInfo->pVS);
    ExtractShaders<Diligent::ShaderGLImpl,_std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>_>
    ::anon_class_24_3_81d571ad::operator()(&local_38,CreateInfo->pHS);
    ExtractShaders<Diligent::ShaderGLImpl,_std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>_>
    ::anon_class_24_3_81d571ad::operator()(&local_38,CreateInfo->pDS);
    ExtractShaders<Diligent::ShaderGLImpl,_std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>_>
    ::anon_class_24_3_81d571ad::operator()(&local_38,CreateInfo->pGS);
    ExtractShaders<Diligent::ShaderGLImpl,_std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>_>
    ::anon_class_24_3_81d571ad::operator()(&local_38,CreateInfo->pPS);
    if (CreateInfo->pVS != (IShader *)0x0) goto LAB_002dbaa2;
    FormatString<char[31]>(&local_58,(char (*) [31])"Vertex shader must not be null");
    Args_1 = (char (*) [22])0xe7;
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0xe7);
  }
  else {
    FormatString<char[22]>(&local_58,(char (*) [22])"unknown pipeline type");
    Args_1 = (char (*) [22])0xf5;
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0xf5);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
LAB_002dbaa2:
  if ((ShaderStages->
      super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>).
      _M_impl.super__Vector_impl_data._M_start ==
      (ShaderStages->
      super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[22]>
              (&local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!ShaderStages.empty()",Args_1);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0xf8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void ExtractShaders(const GraphicsPipelineStateCreateInfo& CreateInfo,
                    TShaderStages&                         ShaderStages,
                    bool                                   WaitUntilShadersReady,
                    SHADER_TYPE&                           ActiveShaderStages)
{
    VERIFY_EXPR(CreateInfo.PSODesc.IsAnyGraphicsPipeline());

    ShaderStages.clear();
    ActiveShaderStages = SHADER_TYPE_UNKNOWN;

    auto AddShaderStage = [&](IShader* pShader) {
        if (pShader != nullptr)
        {
            RefCntAutoPtr<ShaderImplType> pShaderImpl{pShader, ShaderImplType::IID_InternalImpl};
            VERIFY(pShaderImpl, "Unexpected shader object implementation");
            WaitUntilShaderReadyIfRequested(pShaderImpl, WaitUntilShadersReady);
            ShaderStages.emplace_back(pShaderImpl);
            const SHADER_TYPE ShaderType = pShader->GetDesc().ShaderType;
            VERIFY((ActiveShaderStages & ShaderType) == 0,
                   "Shader stage ", GetShaderTypeLiteralName(ShaderType), " has already been initialized in PSO.");
            ActiveShaderStages |= ShaderType;
#ifdef DILIGENT_DEBUG
            for (size_t i = 0; i + 1 < ShaderStages.size(); ++i)
                VERIFY_EXPR(GetShaderStageType(ShaderStages[i]) != ShaderType);
#endif
        }
    };

    switch (CreateInfo.PSODesc.PipelineType)
    {
        case PIPELINE_TYPE_GRAPHICS:
        {
            AddShaderStage(CreateInfo.pVS);
            AddShaderStage(CreateInfo.pHS);
            AddShaderStage(CreateInfo.pDS);
            AddShaderStage(CreateInfo.pGS);
            AddShaderStage(CreateInfo.pPS);
            VERIFY(CreateInfo.pVS != nullptr, "Vertex shader must not be null");
            break;
        }

        case PIPELINE_TYPE_MESH:
        {
            AddShaderStage(CreateInfo.pAS);
            AddShaderStage(CreateInfo.pMS);
            AddShaderStage(CreateInfo.pPS);
            VERIFY(CreateInfo.pMS != nullptr, "Mesh shader must not be null");
            break;
        }

        default:
            UNEXPECTED("unknown pipeline type");
    }

    VERIFY_EXPR(!ShaderStages.empty());
}